

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

void setupBiomeFilter(BiomeFilter *bf,int mc,uint32_t flags,int *required,int requiredLen,
                     int *excluded,int excludedLen,int *matchany,int matchanyLen)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint32_t uVar7;
  int iVar8;
  uint uVar9;
  uint64_t *puVar10;
  uint uVar11;
  uint uVar12;
  int layer;
  int *piVar13;
  uint64_t *puVar14;
  uint64_t *puVar15;
  uint64_t *puVar16;
  uint unaff_R13D;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  int id;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint64_t b;
  uint64_t m;
  uint32_t local_134;
  uint64_t *local_130;
  uint64_t *local_128;
  uint local_11c;
  uint64_t *local_118;
  int *local_110;
  BiomeFilter ibf;
  
  local_130 = (uint64_t *)CONCAT44(local_130._4_4_,requiredLen);
  local_128 = (uint64_t *)excluded;
  local_110 = required;
  memset(bf,0,0xd8);
  bf->flags = flags;
  local_134 = flags;
  if (0 < matchanyLen) {
    uVar20 = 0;
    do {
      unaff_R13D = matchany[uVar20];
      uVar12 = unaff_R13D - 0x80 & 0xff;
      if ((int)unaff_R13D < 0x80) {
        uVar12 = unaff_R13D;
      }
      (&bf->biomeToPick)[0x7f < (int)unaff_R13D] =
           (&bf->biomeToPick)[0x7f < (int)unaff_R13D] | 1L << ((byte)uVar12 & 0x3f);
      local_11c = unaff_R13D;
      setupBiomeFilter(&ibf,mc,0,(int *)&local_11c,1,(int *)0x0,0,(int *)0x0,0);
      if (uVar20 == 0) {
        bf->tempsToFind = ibf.tempsToFind;
        bf->otempToFind = ibf.otempToFind;
        bf->majorToFind = CONCAT44(ibf.majorToFind._4_4_,(uint)ibf.majorToFind);
        bf->edgesToFind = ibf.edgesToFind;
        bf->raresToFind = ibf.raresToFind;
        bf->raresToFindM = ibf.raresToFindM;
        bf->shoreToFind = ibf.shoreToFind;
        bf->shoreToFindM = ibf.shoreToFindM;
        bf->riverToFind = ibf.riverToFind;
        bf->riverToFindM = ibf.riverToFindM;
        uVar17 = ibf.oceanToFind;
      }
      else {
        bf->tempsToFind = bf->tempsToFind & ibf.tempsToFind;
        uVar12 = *(uint *)((long)&bf->otempToFind + 4);
        uVar6 = bf->majorToFind;
        uVar9 = *(uint *)((long)&bf->majorToFind + 4);
        uVar17 = bf->edgesToFind;
        uVar18 = bf->raresToFind;
        uVar2 = bf->raresToFindM;
        uVar3 = bf->shoreToFind;
        uVar4 = bf->shoreToFindM;
        uVar5 = bf->riverToFind;
        *(uint *)&bf->otempToFind = (uint)bf->otempToFind & (uint)ibf.otempToFind;
        *(uint *)((long)&bf->otempToFind + 4) = uVar12 & ibf.otempToFind._4_4_;
        *(uint *)&bf->majorToFind = (uint)uVar6 & (uint)ibf.majorToFind;
        *(uint *)((long)&bf->majorToFind + 4) = uVar9 & ibf.majorToFind._4_4_;
        bf->edgesToFind = ibf.edgesToFind & uVar17;
        bf->raresToFind = ibf.raresToFind & uVar18;
        bf->raresToFindM = ibf.raresToFindM & uVar2;
        bf->shoreToFind = ibf.shoreToFind & uVar3;
        bf->shoreToFindM = ibf.shoreToFindM & uVar4;
        bf->riverToFind = ibf.riverToFind & uVar5;
        bf->riverToFindM = bf->riverToFindM & ibf.riverToFindM;
        uVar17 = bf->oceanToFind & ibf.oceanToFind;
      }
      bf->oceanToFind = uVar17;
      uVar20 = uVar20 + 1;
    } while ((uint)matchanyLen != uVar20);
  }
  puVar16 = (uint64_t *)(ulong)(uint)excludedLen;
  if (0 < excludedLen) {
    uVar20 = 0;
    do {
      unaff_R13D = *(uint *)((long)local_128 + uVar20 * 4);
      if ((unaff_R13D & 0xffffff40) != 0) {
        setupBiomeFilter_cold_1();
        goto LAB_00111bf4;
      }
      uVar12 = unaff_R13D - 0x80;
      if (0x7f >= unaff_R13D) {
        uVar12 = unaff_R13D;
      }
      (&bf->biomeToExcl)[0x7f < unaff_R13D] =
           (&bf->biomeToExcl)[0x7f < unaff_R13D] | 1L << ((byte)uVar12 & 0x3f);
      uVar20 = uVar20 + 1;
    } while ((uint)excludedLen != uVar20);
  }
  local_11c = unaff_R13D;
  if (9 < mc && excludedLen != 0) {
    uVar20 = 0;
    do {
      uVar12 = (uint)uVar20;
      if (4 < uVar20) {
        uVar12 = (uint)uVar20 - 5 | 0xf00;
      }
      m = 0;
      b = 0;
      ibf.majorToFind._4_4_ = local_134;
      ibf.tempsToFind = (uint64_t)&b;
      ibf.otempToFind = (uint64_t)&m;
      ibf.majorToFind._0_4_ = mc;
      _genPotential((_gp_args *)&ibf,0xe,uVar12);
      uVar7 = local_134;
      if (((bf->biomeToExcl & b) != 0) || ((bf->biomeToExclM & m) != 0)) {
        bf->tempsToExcl = bf->tempsToExcl | 1L << ((byte)uVar20 & 0x3f);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != 10);
    uVar20 = 0;
    do {
      id = (int)uVar20;
      iVar8 = isOverworld(mc,id);
      if (iVar8 != 0) {
        if (uVar20 < 0x80) {
          m = 0;
          b = 0;
          ibf.majorToFind._4_4_ = uVar7;
          ibf.tempsToFind = (uint64_t)&b;
          ibf.otempToFind = (uint64_t)&m;
          ibf.majorToFind._0_4_ = mc;
          _genPotential((_gp_args *)&ibf,0x15,id);
          if (((b & ~bf->biomeToExcl) != 0) || ((m & ~bf->biomeToExclM) != 0)) {
            bf->majorToExcl = bf->majorToExcl | 1L << ((byte)uVar20 & 0x3f);
          }
        }
        m = 0;
        b = 0;
        ibf.majorToFind._4_4_ = uVar7;
        ibf.tempsToFind = (uint64_t)&b;
        ibf.otempToFind = (uint64_t)&m;
        ibf.majorToFind._0_4_ = mc;
        _genPotential((_gp_args *)&ibf,0x19,id);
        if (((b & ~bf->biomeToExcl) != 0) || ((m & ~bf->biomeToExclM) != 0)) {
          uVar17 = uVar20 - 0x80;
          if (uVar20 < 0x80) {
            uVar17 = uVar20;
          }
          bf->edgesToExcl = bf->edgesToExcl | 1L << ((byte)uVar17 & 0x3f);
        }
        m = 0;
        b = 0;
        ibf.majorToFind._4_4_ = uVar7;
        ibf.tempsToFind = (uint64_t)&b;
        ibf.otempToFind = (uint64_t)&m;
        ibf.majorToFind._0_4_ = mc;
        _genPotential((_gp_args *)&ibf,0x1e,id);
        if (((b & ~bf->biomeToExcl) != 0) || ((m & ~bf->biomeToExclM) != 0)) {
          uVar17 = uVar20 - 0x80;
          if (0x7f >= uVar20) {
            uVar17 = uVar20;
          }
          (&bf->raresToExcl)[0x7f < uVar20] =
               (&bf->raresToExcl)[0x7f < uVar20] | 1L << ((byte)uVar17 & 0x3f);
        }
        m = 0;
        b = 0;
        ibf.majorToFind._4_4_ = uVar7;
        ibf.tempsToFind = (uint64_t)&b;
        ibf.otempToFind = (uint64_t)&m;
        ibf.majorToFind._0_4_ = mc;
        _genPotential((_gp_args *)&ibf,0x22,id);
        if (((b & ~bf->biomeToExcl) != 0) || ((m & ~bf->biomeToExclM) != 0)) {
          uVar17 = uVar20 - 0x80;
          if (0x7f >= uVar20) {
            uVar17 = uVar20;
          }
          (&bf->shoreToExcl)[0x7f < uVar20] =
               (&bf->shoreToExcl)[0x7f < uVar20] | 1L << ((byte)uVar17 & 0x3f);
        }
        m = 0;
        b = 0;
        ibf.majorToFind._4_4_ = uVar7;
        ibf.tempsToFind = (uint64_t)&b;
        ibf.otempToFind = (uint64_t)&m;
        ibf.majorToFind._0_4_ = mc;
        _genPotential((_gp_args *)&ibf,0x2f,id);
        if (((b & ~bf->biomeToExcl) != 0) || ((m & ~bf->biomeToExclM) != 0)) {
          uVar17 = uVar20 - 0x80;
          if (0x7f >= uVar20) {
            uVar17 = uVar20;
          }
          (&bf->riverToExcl)[0x7f < uVar20] =
               (&bf->riverToExcl)[0x7f < uVar20] | 1L << ((byte)uVar17 & 0x3f);
        }
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != 0x100);
  }
  if (0 < (int)local_130) {
    puVar14 = &bf->riverToFind;
    puVar15 = &bf->riverToFindM;
    puVar16 = &bf->otempToFind;
    uVar20 = (ulong)local_130 & 0xffffffff;
    uVar17 = 0;
    piVar13 = local_110;
    do {
      uVar12 = piVar13[uVar17];
      if ((uVar12 & 0xffffff40) != 0) {
LAB_00111bf4:
        iVar8 = (int)puVar16;
        setupBiomeFilter_cold_2();
        _genPotential((_gp_args *)&stack0xfffffffffffffea0,layer,iVar8);
        return;
      }
      bVar19 = (byte)uVar12;
      puVar10 = puVar14;
      switch(uVar12 & 0xff) {
      case 1:
      case 4:
      case 0x12:
      case 0x22:
        goto switchD_0011181b_caseD_1;
      case 2:
        uVar18 = 4;
        goto LAB_00111aa4;
      case 3:
        *(byte *)&bf->majorToFind = (byte)bf->majorToFind | 8;
        goto switchD_0011181b_caseD_1;
      case 5:
      case 0x13:
        uVar18 = 1L << (bVar19 & 0x3f);
        bf->edgesToFind = bf->edgesToFind | 0x20;
        bf->raresToFind = uVar18 | bf->raresToFind;
        goto LAB_00111aa4;
      case 6:
      case 0x1b:
      case 0x1c:
      case 0x1d:
switchD_0011181b_caseD_6:
        *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 4;
        uVar11 = uVar12 & 0x3f;
        uVar9 = 0x20000000;
        if (((uVar11 == 0x1d) || (uVar9 = 0x8000000, uVar11 - 0x1b < 2)) ||
           (uVar9 = 0x40, uVar11 == 6)) {
          uVar21 = (uint)bf->majorToFind;
          uVar22 = *(uint *)((long)&bf->majorToFind + 4);
          uVar23 = (uint)bf->edgesToFind;
          uVar24 = *(uint *)((long)&bf->edgesToFind + 4);
          uVar11 = 0;
          goto LAB_00111940;
        }
        break;
      case 7:
      case 8:
      case 9:
      case 10:
      case 0x14:
      case 0x18:
switchD_0011181b_caseD_7:
        local_130 = puVar15;
        local_128 = puVar14;
        local_118 = puVar16;
        iVar8 = isOceanic(uVar12);
        if (iVar8 == 0) {
          puVar10 = local_130;
          if (uVar12 < 0x40) {
            puVar10 = local_128;
          }
          uVar18 = 1L << (bVar19 & 0x3f);
          piVar13 = local_110;
          puVar14 = local_128;
          puVar15 = local_130;
          puVar16 = local_118;
          goto LAB_00111aa4;
        }
        *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 1;
        uVar18 = 1L << (bVar19 & 0x3f);
        bf->oceanToFind = bf->oceanToFind | uVar18;
        iVar8 = isShallowOcean(uVar12);
        piVar13 = local_110;
        puVar14 = local_128;
        puVar15 = local_130;
        puVar16 = local_118;
        if (iVar8 == 0) {
          if (bVar19 == 0x32) {
            uVar18 = 0x400;
LAB_00111b70:
            *local_118 = *local_118 | uVar18;
          }
          else {
            uVar18 = 0x100000000000;
            if ((uVar12 & 0xff) == 0x2f) goto LAB_00111b70;
            if ((uVar12 & 0xff) == 0x18) {
              uVar18 = 1;
              goto LAB_00111b70;
            }
          }
          if ((local_134 & 4) == 0) {
            pbVar1 = (byte *)((long)&bf->raresToFind + 3);
            *pbVar1 = *pbVar1 | 1;
            uVar18 = 0x1000000;
            puVar10 = local_128;
            goto LAB_00111aa4;
          }
        }
        else {
          puVar10 = local_118;
          if (uVar12 - 0x2f < 0xfffffffe) goto LAB_00111aa4;
        }
        goto LAB_00111aa7;
      case 0xb:
      case 0xc:
      case 0xd:
      case 0x1e:
      case 0x1f:
switchD_0011181b_caseD_b:
        *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 0x10;
        if (((uVar12 & 0xff) - 0x1e < 2) || ((uVar12 & 0xff) == 0x9e)) {
          pbVar1 = (byte *)((long)&bf->edgesToFind + 3);
          *pbVar1 = *pbVar1 | 0x40;
        }
        else {
          pbVar1 = (byte *)((long)&bf->edgesToFind + 1);
          *pbVar1 = *pbVar1 | 0x10;
          if (uVar12 == 0xb) {
            pbVar1 = (byte *)((long)&bf->raresToFind + 1);
            *pbVar1 = *pbVar1 | 0x10;
            uVar18 = 0x800;
            goto LAB_00111aa4;
          }
        }
        break;
      case 0xe:
        pbVar1 = (byte *)((long)&bf->raresToFind + 1);
        *pbVar1 = *pbVar1 | 0x40;
      case 0xf:
        *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 1;
        pbVar1 = (byte *)((long)&bf->majorToFind + 1);
        *pbVar1 = *pbVar1 | 0x40;
      case 0x10:
      case 0x19:
        goto switchD_0011181b_caseD_10;
      case 0x11:
      case 0x23:
      case 0x24:
switchD_0011181b_caseD_11:
        *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 2;
        uVar9 = 0;
        uVar11 = 8;
        if (uVar12 == 0x11) {
          uVar9 = 4;
          uVar11 = 0;
        }
        if (uVar12 == 0x82) {
          uVar9 = 4;
          uVar11 = 0;
        }
        uVar21 = (uint)bf->majorToFind;
        uVar22 = *(uint *)((long)&bf->majorToFind + 4);
        uVar23 = (uint)bf->edgesToFind;
        uVar24 = *(uint *)((long)&bf->edgesToFind + 4);
LAB_00111940:
        *(uint *)&bf->majorToFind = uVar9 | uVar21;
        *(uint *)((long)&bf->majorToFind + 4) = uVar11 | uVar22;
        *(uint *)&bf->edgesToFind = uVar9 | uVar23;
        *(uint *)((long)&bf->edgesToFind + 4) = uVar11 | uVar24;
        break;
      case 0x15:
      case 0x16:
      case 0x17:
switchD_0011181b_caseD_15:
        *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 0x80;
        pbVar1 = (byte *)((long)&bf->majorToFind + 2);
        *pbVar1 = *pbVar1 | 0x20;
        if ((uVar12 & 0xbe) == 0xa8) {
          pbVar1 = (byte *)((long)&bf->edgesToFind + 5);
          *pbVar1 = *pbVar1 | 1;
        }
        else {
          if (bVar19 == 0x17) {
            uVar18 = 0x800000;
            goto LAB_00111aa4;
          }
          if ((uVar12 & 0xff) != 0x97) {
            pbVar1 = (byte *)((long)&bf->edgesToFind + 2);
            *pbVar1 = *pbVar1 | 0x20;
            break;
          }
          pbVar1 = (byte *)((long)&bf->edgesToFind + 2);
          *pbVar1 = *pbVar1 | 0x80;
        }
        goto switchD_0011185e_caseD_a2;
      case 0x1a:
        *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 0x10;
        goto switchD_0011181b_caseD_10;
      case 0x20:
      case 0x21:
switchD_0011181b_caseD_20:
        pbVar1 = (byte *)((long)&bf->tempsToFind + 1);
        *pbVar1 = *pbVar1 | 1;
        bf->majorToFind = bf->majorToFind | 0x100000000;
        bf->edgesToFind = bf->edgesToFind | 0x100000000;
        break;
      case 0x25:
      case 0x26:
      case 0x27:
switchD_0011181b_caseD_25:
        *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 0x40;
        uVar18 = 0x8000000000;
        if ((uVar12 & 0x3f) == 0x27) {
LAB_0011190d:
          bf->majorToFind = bf->majorToFind | uVar18;
        }
        else if ((uVar12 & 0x3f) == 0x26) {
          uVar18 = 0x4000000000;
          goto LAB_0011190d;
        }
        break;
      default:
        switch(uVar12 & 0xff) {
        case 0x81:
          *(byte *)&bf->raresToFindM = (byte)bf->raresToFindM | 2;
          goto LAB_00111a7f;
        case 0x82:
        case 0xa3:
        case 0xa4:
          goto switchD_0011181b_caseD_11;
        case 0x83:
          *(byte *)&bf->majorToFind = (byte)bf->majorToFind | 8;
          break;
        case 0x84:
          *(byte *)&bf->raresToFindM = (byte)bf->raresToFindM | 0x10;
LAB_00111a7f:
          uVar18 = 1L << (bVar19 & 0x3f);
          puVar10 = puVar15;
          goto LAB_00111aa4;
        case 0x85:
          *(byte *)&bf->edgesToFind = (byte)bf->edgesToFind | 0x20;
          break;
        case 0x86:
        case 0x9b:
        case 0x9c:
        case 0x9d:
          goto switchD_0011181b_caseD_6;
        default:
          goto switchD_0011181b_caseD_7;
        case 0x8c:
        case 0x9e:
          goto switchD_0011181b_caseD_b;
        case 0x95:
        case 0x97:
        case 0xa8:
        case 0xa9:
          goto switchD_0011181b_caseD_15;
        case 0xa0:
        case 0xa1:
          goto switchD_0011181b_caseD_20;
        case 0xa2:
          break;
        case 0xa5:
        case 0xa6:
        case 0xa7:
          goto switchD_0011181b_caseD_25;
        }
        goto switchD_0011185e_caseD_a2;
      }
      if (uVar12 < 0x80) {
switchD_0011181b_caseD_1:
        uVar18 = 1L << (bVar19 & 0x3f);
        bf->raresToFind = bf->raresToFind | uVar18;
      }
      else {
switchD_0011185e_caseD_a2:
        uVar18 = 1L << (bVar19 & 0x3f);
        bf->raresToFindM = bf->raresToFindM | uVar18;
        puVar10 = puVar15;
      }
LAB_00111aa4:
      *puVar10 = *puVar10 | uVar18;
LAB_00111aa7:
      uVar17 = uVar17 + 1;
    } while (uVar20 != uVar17);
  }
  bf->biomeToFind = bf->riverToFind & 0xfffffffffefffffe | bf->oceanToFind;
  bf->biomeToFindM = bf->riverToFindM;
  bf->shoreToFind = bf->riverToFind & 0xfffffffffffff77f;
  bf->shoreToFindM = bf->riverToFindM;
  uVar12 = (uint)bf->tempsToFind;
  bf->specialCnt = (uVar12 >> 7 & 1) + (uVar12 >> 6 & 1) + (uint)((uVar12 >> 8 & 1) != 0);
  return;
switchD_0011181b_caseD_10:
  uVar18 = 1L << (bVar19 & 0x3f);
  goto LAB_00111aa4;
}

Assistant:

void setupBiomeFilter(
    BiomeFilter *bf,
    int mc, uint32_t flags,
    const int *required, int requiredLen,
    const int *excluded, int excludedLen,
    const int *matchany, int matchanyLen)
{
    int i, id;

    memset(bf, 0, sizeof(*bf));
    bf->flags = flags;

    // The matchany set is built from the intersection of each member,
    // individually treated as a required biome. The search can be aborted with
    // a positive result, as soon as any of those biomes is encountered.
    for (i = 0; i < matchanyLen; i++)
    {
        id = matchany[i];
        if (id < 128)
            bf->biomeToPick |= (1ULL << id);
        else
            bf->biomeToPickM |= (1ULL << (id-128));

        BiomeFilter ibf;
        setupBiomeFilter(&ibf, mc, 0, &id, 1, 0, 0, 0, 0);
        if (i == 0)
        {
            bf->tempsToFind  = ibf.tempsToFind;
            bf->otempToFind  = ibf.otempToFind;
            bf->majorToFind  = ibf.majorToFind;
            bf->edgesToFind  = ibf.edgesToFind;
            bf->raresToFind  = ibf.raresToFind;
            bf->raresToFindM = ibf.raresToFindM;
            bf->shoreToFind  = ibf.shoreToFind;
            bf->shoreToFindM = ibf.shoreToFindM;
            bf->riverToFind  = ibf.riverToFind;
            bf->riverToFindM = ibf.riverToFindM;
            bf->oceanToFind  = ibf.oceanToFind;
        }
        else
        {
            bf->tempsToFind  &= ibf.tempsToFind;
            bf->otempToFind  &= ibf.otempToFind;
            bf->majorToFind  &= ibf.majorToFind;
            bf->edgesToFind  &= ibf.edgesToFind;
            bf->raresToFind  &= ibf.raresToFind;
            bf->raresToFindM &= ibf.raresToFindM;
            bf->shoreToFind  &= ibf.shoreToFind;
            bf->shoreToFindM &= ibf.shoreToFindM;
            bf->riverToFind  &= ibf.riverToFind;
            bf->riverToFindM &= ibf.riverToFindM;
            bf->oceanToFind  &= ibf.oceanToFind;
        }
    }

    // The excluded set is built by checking which of the biomes from each
    // layer have the potential to yield something other than one of the
    // excluded biomes.
    for (i = 0; i < excludedLen; i++)
    {
        id = excluded[i];
        if (id & ~0xbf) // i.e. not in ranges [0,64),[128,192)
        {
            fprintf(stderr, "setupBiomeFilter: biomeID=%d not supported.\n", id);
            exit(-1);
        }
        if (id < 128)
            bf->biomeToExcl |= (1ULL << id);
        else
            bf->biomeToExclM |= (1ULL << (id-128));
    }
    if (excludedLen && mc >= MC_1_7)
    {   // TODO: this does not fully work yet...
        uint64_t b, m;
        int j;
        for (j = Oceanic; j <= Freezing+Special; j++)
        {
            b = m = 0;
            int temp = (j <= Freezing) ? j : ((j - Special) | 0xf00);
            genPotential(&b, &m, L_SPECIAL_1024, mc, flags, temp);
            if ((bf->biomeToExcl & b) || (bf->biomeToExclM & m))
                bf->tempsToExcl |= (1ULL << j);
        }
        for (j = 0; j < 256; j++)
        {
            if (!isOverworld(mc, j))
                continue;
            if (j < 128)
            {
                b = m = 0;
                genPotential(&b, &m, L_BIOME_256, mc, flags, j);
                if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
                    bf->majorToExcl |= (1ULL << j);
            }
            b = m = 0;
            genPotential(&b, &m, L_BIOME_EDGE_64, mc, flags, j);
            if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
            {
                if (j < 128)
                    bf->edgesToExcl |= (1ULL << j);
                else // bamboo_jungle are mapped onto & 0x3F
                    bf->edgesToExcl |= (1ULL << (j-128));
            }
            b = m = 0;
            genPotential(&b, &m, L_SUNFLOWER_64, mc, flags, j);
            if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
            {
                if (j < 128)
                    bf->raresToExcl |= (1ULL << j);
                else
                    bf->raresToExclM |= (1ULL << (j-128));
            }
            b = m = 0;
            genPotential(&b, &m, L_SHORE_16, mc, flags, j);
            if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
            {
                if (j < 128)
                    bf->shoreToExcl |= (1ULL << j);
                else
                    bf->shoreToExclM |= (1ULL << (j-128));
            }
            b = m = 0;
            genPotential(&b, &m, L_RIVER_MIX_4, mc, flags, j);
            if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
            {
                if (j < 128)
                    bf->riverToExcl |= (1ULL << j);
                else
                    bf->riverToExclM |= (1ULL << (j-128));
            }
        }
    }

    // The required set is built from the biomes that should be present at each
    // of the layers. The search can be aborted with a negative result as soon
    // as a biome is missing at the corresponding layer.
    for (i = 0; i < requiredLen; i++)
    {
        id = required[i];
        if (id & ~0xbf) // i.e. not in ranges [0,64),[128,192)
        {
            fprintf(stderr, "setupBiomeFilter: biomeID=%d not supported.\n", id);
            exit(-1);
        }

        switch (id)
        {
        case mushroom_fields:
            // mushroom shores can generate with hills and at rivers
            bf->raresToFind |= (1ULL << mushroom_fields);
            // fall through
        case mushroom_field_shore:
            bf->tempsToFind |= (1ULL << Oceanic);
            bf->majorToFind |= (1ULL << mushroom_fields);
            bf->riverToFind |= (1ULL << id);
            break;

        case badlands_plateau:
        case wooded_badlands_plateau:
        case badlands:
        case eroded_badlands:
        case modified_badlands_plateau:
        case modified_wooded_badlands_plateau:
            bf->tempsToFind |= (1ULL << (Warm+Special));
            if (id == badlands_plateau || id == modified_badlands_plateau)
                bf->majorToFind |= (1ULL << badlands_plateau);
            if (id == wooded_badlands_plateau || id == modified_wooded_badlands_plateau)
                bf->majorToFind |= (1ULL << wooded_badlands_plateau);
            if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case jungle:
        case jungle_edge:
        case jungle_hills:
        case modified_jungle:
        case modified_jungle_edge:
        case bamboo_jungle:
        case bamboo_jungle_hills:
            bf->tempsToFind |= (1ULL << (Lush+Special));
            bf->majorToFind |= (1ULL << jungle);
            if (id == bamboo_jungle || id == bamboo_jungle_hills) {
                // bamboo%64 are End biomes, so we can reuse the edgesToFind
                bf->edgesToFind |= (1ULL << (bamboo_jungle & 0x3f));
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            } else if (id == jungle_edge) {
                // un-modified jungle_edge can be created at shore layer
                bf->riverToFind |= (1ULL << jungle_edge);
            } else {
                if (id == modified_jungle_edge)
                    bf->edgesToFind |= (1ULL << jungle_edge);
                else
                    bf->edgesToFind |= (1ULL << jungle);
                if (id < 128) {
                    bf->raresToFind |= (1ULL << id);
                    bf->riverToFind |= (1ULL << id);
                } else {
                    bf->raresToFindM |= (1ULL << (id-128));
                    bf->riverToFindM |= (1ULL << (id-128));
                }
            }
            break;

        case giant_tree_taiga:
        case giant_tree_taiga_hills:
        case giant_spruce_taiga:
        case giant_spruce_taiga_hills:
            bf->tempsToFind |= (1ULL << (Cold+Special));
            bf->majorToFind |= (1ULL << giant_tree_taiga);
            bf->edgesToFind |= (1ULL << giant_tree_taiga);
            if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case savanna:
        case savanna_plateau:
        case shattered_savanna:
        case shattered_savanna_plateau:
        case desert_hills:
        case desert_lakes:
            bf->tempsToFind |= (1ULL << Warm);
            if (id == desert_hills || id == desert_lakes) {
                bf->majorToFind |= (1ULL << desert);
                bf->edgesToFind |= (1ULL << desert);
            } else {
                bf->majorToFind |= (1ULL << savanna);
                bf->edgesToFind |= (1ULL << savanna);
            }
            if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case dark_forest:
        case dark_forest_hills:
        case birch_forest:
        case birch_forest_hills:
        case tall_birch_forest:
        case tall_birch_hills:
        case swamp:
        case swamp_hills:
            bf->tempsToFind |= (1ULL << Lush);
            if (id == dark_forest || id == dark_forest_hills) {
                bf->majorToFind |= (1ULL << dark_forest);
                bf->edgesToFind |= (1ULL << dark_forest);
            }
            else if (id == birch_forest || id == birch_forest_hills ||
                     id == tall_birch_forest || id == tall_birch_hills) {
                bf->majorToFind |= (1ULL << birch_forest);
                bf->edgesToFind |= (1ULL << birch_forest);
            }
            else if (id == swamp || id == swamp_hills) {
                bf->majorToFind |= (1ULL << swamp);
                bf->edgesToFind |= (1ULL << swamp);
            }
            if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case snowy_taiga:
        case snowy_taiga_hills:
        case snowy_taiga_mountains:
        case snowy_tundra:
        case snowy_mountains:
        case ice_spikes:
        case frozen_river:
            bf->tempsToFind |= (1ULL << Freezing);
            if (id == snowy_taiga || id == snowy_taiga_hills ||
                id == snowy_taiga_mountains)
                bf->edgesToFind |= (1ULL << snowy_taiga);
            else
                bf->edgesToFind |= (1ULL << snowy_tundra);
            if (id == frozen_river) {
                bf->raresToFind |= (1ULL << snowy_tundra);
                bf->riverToFind |= (1ULL << id);
            } else if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case sunflower_plains:
            bf->raresToFindM |= (1ULL << (id-128));
            bf->riverToFindM |= (1ULL << (id-128));
            break;

        case snowy_beach:
            bf->tempsToFind |= (1ULL << Freezing);
            // fall through
        case beach:
        case stone_shore:
            bf->riverToFind |= (1ULL << id);
            break;

        case mountains:
            bf->majorToFind |= (1ULL << mountains);
            // fall through
        case wooded_mountains:
            bf->raresToFind |= (1ULL << id);
            bf->riverToFind |= (1ULL << id);
            break;
        case gravelly_mountains:
            bf->majorToFind |= (1ULL << mountains);
            // fall through
        case modified_gravelly_mountains:
            bf->raresToFindM |= (1ULL << (id-128));
            bf->riverToFindM |= (1ULL << (id-128));
            break;

        case taiga:
        case taiga_hills:
            bf->edgesToFind |= (1ULL << taiga);
            bf->raresToFind |= (1ULL << id);
            bf->riverToFind |= (1ULL << id);
            break;
        case taiga_mountains:
            bf->edgesToFind |= (1ULL << taiga);
            bf->raresToFindM |= (1ULL << (id-128));
            bf->riverToFindM |= (1ULL << (id-128));
            break;

        case plains:
        case forest:
        case wooded_hills:
            bf->raresToFind |= (1ULL << id);
            bf->riverToFind |= (1ULL << id);
            break;
        case flower_forest:
            bf->raresToFindM |= (1ULL << (id-128));
            bf->riverToFindM |= (1ULL << (id-128));
            break;

        case desert: // can generate at shore layer
            bf->riverToFind |= (1ULL << id);
            break;

        default:
            if (isOceanic(id)) {
                bf->tempsToFind |= (1ULL << Oceanic);
                bf->oceanToFind |= (1ULL << id);
                if (isShallowOcean(id)) {
                    if (id != lukewarm_ocean && id != cold_ocean)
                        bf->otempToFind |= (1ULL << id);
                } else {
                    if (id == deep_warm_ocean)
                        bf->otempToFind |= (1ULL << warm_ocean);
                    else if (id == deep_ocean)
                        bf->otempToFind |= (1ULL << ocean);
                    else if (id == deep_frozen_ocean)
                        bf->otempToFind |= (1ULL << frozen_ocean);
                    if (!(flags & FORCE_OCEAN_VARIANTS)) {
                        bf->raresToFind |= (1ULL << deep_ocean);
                        bf->riverToFind |= (1ULL << deep_ocean);
                    }
                }
            } else {
                if (id < 64)
                    bf->riverToFind |= (1ULL << id);
                else
                    bf->riverToFindM |= (1ULL << (id-128));
            }
            break;
        }
    }

    bf->biomeToFind = bf->riverToFind;
    bf->biomeToFind &= ~((1ULL << ocean) | (1ULL << deep_ocean));
    bf->biomeToFind |= bf->oceanToFind;
    bf->biomeToFindM = bf->riverToFindM;

    bf->shoreToFind = bf->riverToFind;
    bf->shoreToFind &= ~((1ULL << river) | (1ULL << frozen_river));
    bf->shoreToFindM = bf->riverToFindM;

    bf->specialCnt = 0;
    bf->specialCnt += !!(bf->tempsToFind & (1ULL << (Warm+Special)));
    bf->specialCnt += !!(bf->tempsToFind & (1ULL << (Lush+Special)));
    bf->specialCnt += !!(bf->tempsToFind & (1ULL << (Cold+Special)));
}